

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.c
# Opt level: O0

int project_tube(float *f,int *i,int c)

{
  float fVar1;
  int in_EDX;
  int *in_RSI;
  float *in_RDI;
  double dVar2;
  double dVar3;
  float z;
  float y;
  float x;
  float size;
  float ysize;
  float xsize;
  float ang;
  float local_34;
  int local_14;
  int *local_10;
  float *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_14 = in_EDX; 0 < local_14; local_14 = local_14 + -2) {
    fVar1 = *local_8 * 3.1415927 + *local_8 * 3.1415927 + 1.5707964;
    local_34 = view_bottom - view_top;
    if (view_right - view_left < local_34) {
      local_34 = view_right - view_left;
    }
    dVar2 = cos((double)fVar1);
    dVar3 = sin((double)fVar1);
    fVar1 = (1.0 - local_8[1]) * 8.0 + 1.0;
    *local_10 = (int)(((float)dVar2 / fVar1) * (local_34 / 2.0) + (view_left + view_right) / 2.0);
    local_10[1] = (int)(((float)dVar3 / fVar1) * (local_34 / 2.0) + (view_top + view_bottom) / 2.0);
    local_8 = local_8 + 2;
    local_10 = local_10 + 2;
  }
  return -1;
}

Assistant:

static int project_tube(float *f, int *i, int c)
{
   while (c > 0) {
      float ang = f[0] * M_PI * 2.0 + M_PI / 2.0;

      float xsize = view_right - view_left;
      float ysize = view_bottom - view_top;
      float size = MIN(xsize, ysize) / 2.0;

      float x = cos(ang);
      float y = sin(ang);

      float z = 1.0 + (1.0 - f[1]) * 8.0;

      i[0] = x/z * size + (view_left + view_right) / 2.0;
      i[1] = y/z * size + (view_top + view_bottom) / 2.0;

      f += 2;
      i += 2;
      c -= 2;
   }

   return TRUE;
}